

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_sparse_old_parse(archive_read *a,tar *tar,gnu_sparse *sparse,wchar_t length)

{
  uint uVar1;
  wchar_t wVar2;
  tar *tar_00;
  int in_ECX;
  char *in_RDX;
  int64_t in_RSI;
  int64_t in_RDI;
  char *in_stack_ffffffffffffffb8;
  int64_t remaining;
  int64_t offset;
  uint in_stack_ffffffffffffffd8;
  char *local_20;
  
  local_20 = in_RDX;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd8 & 0xffffff;
    if (0 < in_ECX) {
      uVar1 = CONCAT13(*local_20 != '\0',(int3)in_stack_ffffffffffffffd8);
    }
    in_stack_ffffffffffffffd8 = uVar1;
    if ((char)(in_stack_ffffffffffffffd8 >> 0x18) == '\0') break;
    remaining = in_RDI;
    offset = in_RSI;
    tar_00 = (tar *)tar_atol(in_stack_ffffffffffffffb8,0x153023);
    tar_atol(in_stack_ffffffffffffffb8,0x15303b);
    wVar2 = gnu_add_sparse_entry
                      ((archive_read *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),tar_00,offset,
                       remaining);
    if (wVar2 != L'\0') {
      return L'\xffffffe2';
    }
    local_20 = local_20 + 0x18;
    in_ECX = in_ECX + -1;
  }
  return L'\0';
}

Assistant:

static int
gnu_sparse_old_parse(struct archive_read *a, struct tar *tar,
    const struct gnu_sparse *sparse, int length)
{
	while (length > 0 && sparse->offset[0] != 0) {
		if (gnu_add_sparse_entry(a, tar,
		    tar_atol(sparse->offset, sizeof(sparse->offset)),
		    tar_atol(sparse->numbytes, sizeof(sparse->numbytes)))
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		sparse++;
		length--;
	}
	return (ARCHIVE_OK);
}